

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O3

void __thiscall BigInteger::multiply(BigInteger *this,uint a)

{
  ulong in_RAX;
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  iterator __position;
  ulong uVar4;
  ulong uVar5;
  undefined8 uStack_38;
  
  puVar1 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)__position._M_current - (long)puVar1 != 0) {
    uVar2 = (long)__position._M_current - (long)puVar1 >> 2;
    uVar5 = 0;
    uVar3 = 0;
    uStack_38 = in_RAX;
    do {
      if (uVar2 <= uVar3) {
        uStack_38 = uStack_38 & 0xffffffff;
        if (__position._M_current ==
            (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&this->digits,__position,(uint *)((long)&uStack_38 + 4));
          puVar1 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *__position._M_current = 0;
          (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar4 = (ulong)puVar1[uVar3] * (ulong)a + uVar5;
      uVar5 = uVar4 / 1000000000;
      puVar1[uVar3] = (int)uVar4 + (int)uVar5 * -1000000000;
      uVar3 = uVar3 + 1;
      __position._M_current =
           (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar2 = (long)__position._M_current - (long)puVar1 >> 2;
    } while ((999999999 < uVar4) || (uVar3 < uVar2));
  }
  return;
}

Assistant:

void BigInteger::multiply(unsigned a) noexcept
{
    long long carry = 0;
    for(size_t i = 0; carry || i < digits.size(); i++)
    {
        if(i >= digits.size())
            digits.push_back(0);
        long long new_carry = (digits[i] * 1ll * a + carry) / BLOCK_MOD;
        digits[i] = (digits[i] * 1ll * a + carry) % BLOCK_MOD;
        carry = new_carry;
    }
}